

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_Grp4.c
# Opt level: O0

void G4_Eb(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    (pMyDisasm->Reserved_).REGOPCODE =
         (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3 & 7;
    if ((pMyDisasm->Reserved_).REGOPCODE == 0) {
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Prefix).LockPrefix = '\x01';
      }
      (pMyDisasm->Instruction).Category = 0x10002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"inc");
      Eb(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
      if (((pMyDisasm->Prefix).LockPrefix == '\x01') && ((pMyDisasm->Reserved_).MOD_ == 3)) {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      FillFlags(pMyDisasm,0x28);
    }
    else if ((pMyDisasm->Reserved_).REGOPCODE == 1) {
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Prefix).LockPrefix = '\x01';
      }
      (pMyDisasm->Instruction).Category = 0x10002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"dec");
      Eb(pMyDisasm);
      if (((pMyDisasm->Prefix).LockPrefix == '\x01') && ((pMyDisasm->Reserved_).MOD_ == 3)) {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      FillFlags(pMyDisasm,0x1e);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  return;
}

Assistant:

void __bea_callspec__ G4_Eb(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
    if (GV.REGOPCODE == 0) {
        if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
            pMyDisasm->Prefix.LockPrefix = InUsePrefix;
        }
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "inc");
        #endif
        Eb(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
        if ((pMyDisasm->Prefix.LockPrefix == InUsePrefix) && (GV.MOD_ == 0x3)) {
            GV.ERROR_OPCODE = UD_;
        }
        FillFlags(pMyDisasm, 40);
    }
    else if (GV.REGOPCODE == 1) {
        if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
            pMyDisasm->Prefix.LockPrefix = InUsePrefix;
        }
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "dec");
        #endif
        Eb(pMyDisasm);
        if ((pMyDisasm->Prefix.LockPrefix == InUsePrefix) && (GV.MOD_ == 0x3)) {
            GV.ERROR_OPCODE = UD_;
        }
        FillFlags(pMyDisasm, 30);
    }
    else {
        failDecode(pMyDisasm);
    }
}